

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

Term * Kernel::SubstHelper::
       applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::DerefApplicator>
                 (Term *trm,DerefApplicator *applicator,bool noSharing)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  SpecialFunctor SVar4;
  uint uVar5;
  Stack<Kernel::TermList_*> *this;
  Stack<Kernel::Term_*> *pSVar6;
  Stack<Kernel::TermList> *pSVar7;
  Stack<Kernel::TermList> *pSVar8;
  size_t sVar9;
  TermList *pTVar10;
  Stack<bool> *pSVar11;
  Term *pTVar12;
  byte in_DL;
  __off_t __length;
  __off_t __length_00;
  Term *in_RSI;
  Term *in_RDI;
  bool shouldShare_1;
  Literal *lit;
  TermList *argLst_1;
  Term *result;
  Term *t;
  TermList tDest_1;
  TermList tDest;
  TermList tl;
  Term *newTrm;
  bool shouldShare;
  TermList *argLst;
  Term *orig;
  TermList *tt;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> args;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> modified;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> terms;
  Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> toDo;
  uint i;
  DArray<Kernel::TermList> terms_1;
  SpecialTermData *sd;
  Term *in_stack_fffffffffffffc08;
  TermList in_stack_fffffffffffffc10;
  TermList *in_stack_fffffffffffffc18;
  uint in_stack_fffffffffffffc24;
  DerefApplicator *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  Stack<Kernel::TermList> *in_stack_fffffffffffffc50;
  Stack<Kernel::TermList> *in_stack_fffffffffffffc80;
  Term *in_stack_fffffffffffffc88;
  bool local_281;
  Term *local_1b8;
  TermList local_190;
  uint64_t local_188;
  TermList local_180;
  TermList local_178 [2];
  Term *local_168;
  bool local_159;
  TermList *local_158;
  Term *local_148;
  TermList *local_140;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_DL & 1;
  bVar2 = Term::isSpecial((Term *)0x41f80f);
  if (bVar2) {
    Term::getSpecialData(in_RDI);
    SVar4 = Term::specialFunctor((Term *)0x41f83a);
    pTVar12 = (Term *)(*(code *)(&DAT_00ed59d4 + *(int *)(&DAT_00ed59d4 + (ulong)SVar4 * 4)))();
    return pTVar12;
  }
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_fffffffffffffc10._content);
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffc10._content);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffc10._content);
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffc10._content);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
            ((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x41fdec);
  Lib::Stack<bool>::push
            ((Stack<bool> *)in_stack_fffffffffffffc10._content,
             SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)0x41fe14);
  Term::args(in_RDI);
  Lib::Stack<Kernel::TermList_*>::push
            ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffc10._content,
             (TermList *)in_stack_fffffffffffffc08);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            this = Lib::
                   Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   ::operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                 *)0x41fe4c);
            local_140 = Lib::Stack<Kernel::TermList_*>::pop(this);
            bVar2 = TermList::isEmpty((TermList *)0x41fe78);
            if (!bVar2) break;
            pSVar6 = Lib::
                     Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     ::operator->((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)0x41fe9e);
            bVar2 = Lib::Stack<Kernel::Term_*>::isEmpty(pSVar6);
            if (bVar2) {
              pSVar11 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        ::operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                      *)0x4206db);
              bVar2 = Lib::Stack<bool>::pop(pSVar11);
              local_1b8 = in_RDI;
              if (bVar2) {
                in_stack_fffffffffffffc50 =
                     Lib::
                     Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)0x420712);
                pTVar10 = Lib::Stack<Kernel::TermList>::top(in_stack_fffffffffffffc50);
                uVar5 = Term::arity(in_RDI);
                pTVar10 = pTVar10 + -(ulong)(uVar5 - 1);
                bVar2 = Term::isLiteral((Term *)0x42075a);
                if (bVar2) {
                  local_1b8 = &Literal::create((Literal *)in_stack_fffffffffffffc88,
                                               (TermList *)in_stack_fffffffffffffc80)->super_Term;
                }
                else {
                  uVar3 = Term::isSort((Term *)0x4207b5);
                  if ((bool)uVar3) {
                    local_1b8 = &AtomicSort::create((AtomicSort *)in_stack_fffffffffffffc10._content
                                                    ,(TermList *)in_stack_fffffffffffffc08)->
                                 super_Term;
                  }
                  else {
                    bVar2 = false;
                    if ((bVar1 & 1) == 0) {
                      Term::arity(in_RDI);
                      bVar2 = canBeShared(pTVar10,in_stack_fffffffffffffc10._content);
                    }
                    if (bVar2 == false) {
                      local_1b8 = Term::createNonShared
                                            ((Term *)CONCAT17(uVar3,in_stack_fffffffffffffc30),
                                             (TermList *)in_stack_fffffffffffffc28);
                    }
                    else {
                      local_1b8 = Term::create((Term *)in_stack_fffffffffffffc10._content,
                                               (TermList *)in_stack_fffffffffffffc08);
                    }
                  }
                }
              }
              Lib::
              Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              ~Recycled((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)in_stack_fffffffffffffc50);
              Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              ~Recycled((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                        in_stack_fffffffffffffc50);
              Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffc50);
              Lib::
              Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffc50);
              return local_1b8;
            }
            pSVar6 = Lib::
                     Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     ::operator->((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)0x41ff3e);
            local_148 = Lib::Stack<Kernel::Term_*>::pop(pSVar6);
            pSVar11 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                      operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                  *)0x41ff6a);
            bVar2 = Lib::Stack<bool>::pop(pSVar11);
            if (bVar2) {
              pSVar7 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x42004a);
              pTVar10 = Lib::Stack<Kernel::TermList>::top(pSVar7);
              uVar5 = Term::arity(local_148);
              local_158 = pTVar10 + -(ulong)(uVar5 - 1);
              local_281 = false;
              if ((bVar1 & 1) == 0) {
                Term::arity(local_148);
                local_281 = canBeShared(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10._content
                                       );
              }
              local_159 = local_281;
              if (local_281 == false) {
                local_168 = Term::createNonShared
                                      ((Term *)CONCAT17(in_stack_fffffffffffffc37,
                                                        in_stack_fffffffffffffc30),
                                       (TermList *)in_stack_fffffffffffffc28);
              }
              else {
                bVar2 = Term::isSort((Term *)0x420120);
                if (bVar2) {
                  local_168 = &AtomicSort::create((AtomicSort *)in_stack_fffffffffffffc10._content,
                                                  (TermList *)in_stack_fffffffffffffc08)->super_Term
                  ;
                }
                else {
                  local_168 = Term::create((Term *)in_stack_fffffffffffffc10._content,
                                           (TermList *)in_stack_fffffffffffffc08);
                }
              }
              pSVar7 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x4201d4);
              pSVar8 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x4201eb);
              sVar9 = Lib::Stack<Kernel::TermList>::length(pSVar8);
              uVar5 = Term::arity(local_148);
              Lib::Stack<Kernel::TermList>::truncate(pSVar7,(char *)(sVar9 - uVar5),__length_00);
              Lib::
              Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x42023e);
              TermList::TermList((TermList *)in_stack_fffffffffffffc10._content,
                                 in_stack_fffffffffffffc08);
              Lib::Stack<Kernel::TermList>::push
                        ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc08,
                         in_stack_fffffffffffffc10);
              pSVar11 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        ::operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                      *)0x420283);
              Lib::Stack<bool>::setTop(pSVar11,true);
            }
            else {
              pSVar7 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x41ff96);
              pSVar8 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x41ffad);
              sVar9 = Lib::Stack<Kernel::TermList>::length(pSVar8);
              uVar5 = Term::arity(local_148);
              Lib::Stack<Kernel::TermList>::truncate(pSVar7,(char *)(sVar9 - uVar5),__length);
              Lib::
              Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x420000);
              TermList::TermList((TermList *)in_stack_fffffffffffffc10._content,
                                 in_stack_fffffffffffffc08);
              Lib::Stack<Kernel::TermList>::push
                        ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc08,
                         in_stack_fffffffffffffc10);
            }
          }
          Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x4202b1);
          TermList::next(local_140);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffc10._content,
                     (TermList *)in_stack_fffffffffffffc08);
          local_178[0]._content = local_140->_content;
          bVar2 = TermList::isOrdinaryVar((TermList *)0x4202fa);
          if (!bVar2) break;
          TermList::var(local_178);
          local_180 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
                      InstMatcher::DerefApplicator::apply
                                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
          Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)0x420366);
          local_188 = local_180._content;
          Lib::Stack<Kernel::TermList>::push
                    ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc10)
          ;
          bVar2 = TermList::operator!=(&local_180,local_178);
          if (bVar2) {
            pSVar11 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                      operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                  *)0x4203bf);
            Lib::Stack<bool>::setTop(pSVar11,true);
          }
        }
        bVar2 = TermList::isSpecialVar((TermList *)0x4203ed);
        if (!bVar2) break;
        TermList::var(local_178);
        local_190 = SubstHelper_Aux::SpecVarHandler<true>::
                    apply<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::DerefApplicator>
                              ((DerefApplicator *)in_stack_fffffffffffffc08,0);
        Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x420459);
        Lib::Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc10);
        bVar2 = TermList::operator!=(&local_190,local_178);
        if (bVar2) {
          pSVar11 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                    operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                *)0x4204b2);
          Lib::Stack<bool>::setTop(pSVar11,true);
        }
      }
      bVar2 = TermList::isVar((TermList *)in_stack_fffffffffffffc10._content);
      if (!bVar2) break;
LAB_0042056a:
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x420577);
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc10);
    }
    TermList::term((TermList *)0x420503);
    bVar2 = Term::shared((Term *)0x42051a);
    if (bVar2) {
      TermList::term((TermList *)0x42053d);
      bVar2 = Term::ground((Term *)0x420554);
      if (bVar2) goto LAB_0042056a;
    }
    pTVar12 = TermList::term((TermList *)0x4205ba);
    in_stack_fffffffffffffc88 = pTVar12;
    bVar2 = Term::isSpecial((Term *)0x4205e1);
    if (bVar2) {
      in_stack_fffffffffffffc80 =
           Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x4205f4);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::DerefApplicator>
                (in_RSI,(DerefApplicator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                 SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
      TermList::TermList((TermList *)in_stack_fffffffffffffc10._content,in_stack_fffffffffffffc08);
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc10);
    }
    else {
      Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x42065c);
      Lib::Stack<Kernel::Term_*>::push
                ((Stack<Kernel::Term_*> *)in_stack_fffffffffffffc10._content,
                 in_stack_fffffffffffffc08);
      Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
                ((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x420684
                );
      Lib::Stack<bool>::push
                ((Stack<bool> *)in_stack_fffffffffffffc10._content,
                 SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
      Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x4206a6);
      Term::args(pTVar12);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffc10._content,
                 (TermList *)in_stack_fffffffffffffc08);
    }
  } while( true );
}

Assistant:

Term* SubstHelper::applyImpl(Term* trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm->isSpecial()) {
    Term::SpecialTermData* sd = trm->getSpecialData();
    switch(trm->specialFunctor()) {
    case SpecialFunctor::ITE:
      return Term::createITE(
    applyImpl<ProcessSpecVars>(sd->getCondition(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(1), applicator, noSharing),
    applyImpl<ProcessSpecVars>(sd->getSort(), applicator, noSharing)
    );
    case SpecialFunctor::LET:
      return Term::createLet(
    sd->getFunctor(),
    sd->getVariables(),
    applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    sd->getSort()
    );
    case SpecialFunctor::FORMULA:
      return Term::createFormula(
      applyImpl<ProcessSpecVars>(sd->getFormula(), applicator, noSharing)
      );
    case SpecialFunctor::LET_TUPLE:
      return Term::createTupleLet(
        sd->getFunctor(),
        sd->getTupleSymbols(),
        applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
        applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
        sd->getSort()
        );
    case SpecialFunctor::TUPLE:
      return Term::createTuple(applyImpl<ProcessSpecVars>(sd->getTupleTerm(), applicator, noSharing));
    case SpecialFunctor::LAMBDA:
      // TODO in principle this should not be so difficult to handle
      ASSERTION_VIOLATION;
    case SpecialFunctor::MATCH: {
      DArray<TermList> terms(trm->arity());
      for (unsigned i = 0; i < trm->arity(); i++) {
        terms[i] = applyImpl<ProcessSpecVars>(*trm->nthArgument(i), applicator, noSharing);
      }
      return Term::createMatch(sd->getSort(), sd->getMatchedSort(), trm->arity(), terms.begin());
    }
    }
    ASSERTION_VIOLATION;
  }

  Recycled<Stack<TermList*>> toDo;
  Recycled<Stack<Term*>> terms;
  Recycled<Stack<bool>> modified;
  Recycled<Stack<TermList>> args;

  modified->push(false);
  toDo->push(trm->args());

  for(;;) {
    TermList* tt=toDo->pop();
    if(tt->isEmpty()) {
      if(terms->isEmpty()) {
        //we're done, args stack contains modified arguments
        //of the topleve term/literal.
        ASS(toDo->isEmpty());
        break;
      }
      Term* orig=terms->pop();
      if(!modified->pop()) {
        args->truncate(args->length() - orig->arity());
        args->push(TermList(orig));
        continue;
      }
      //here we assume, that stack is an array with
      //second topmost element as &top()-1, third at
      //&top()-2, etc...
      TermList* argLst=&args->top() - (orig->arity()-1);

      bool shouldShare=!noSharing && canBeShared(argLst, orig->arity());

      Term* newTrm;
      if(shouldShare) {
        if(orig->isSort()){
          newTrm=AtomicSort::create(static_cast<AtomicSort*>(orig), argLst);
        } else {
          newTrm=Term::create(orig,argLst);
        }
      }
      else {
        newTrm=Term::createNonShared(orig,argLst);
      }
      args->truncate(args->length() - orig->arity());
      args->push(TermList(newTrm));

      modified->setTop(true);
      continue;
    }
    toDo->push(tt->next());

    TermList tl=*tt;
    if(tl.isOrdinaryVar()) {
      TermList tDest=applicator.apply(tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    if(tl.isSpecialVar()) {
      TermList tDest=SpecVarHandler<ProcessSpecVars>::apply(applicator,tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    ASS(tl.isTerm());
    if(tl.isVar() || (tl.term()->shared() && tl.term()->ground())) {
      args->push(tl);
      continue;
    }
    Term* t = tl.term();
    if(t->isSpecial()) {
      //we handle specal terms at the top level of this function
      args->push(TermList(applyImpl<ProcessSpecVars>(t, applicator, noSharing)));
      continue;
    }
    terms->push(t);
    modified->push(false);
    toDo->push(t->args());
  }
  ASS(toDo->isEmpty());
  ASS(terms->isEmpty());
  ASS_EQ(modified->length(),1);
  ASS_EQ(args->length(),trm->arity());

  Term* result;
  if(!modified->pop()) {
    result=trm;
  }
  else {
    //here we assume, that stack is an array with
    //second topmost element as &top()-1, third at
    //&top()-2, etc...
    TermList* argLst=&args->top() - (trm->arity()-1);
    ASS_EQ(args->size(), trm->arity());
    if(trm->isLiteral()) {
      ASS(!noSharing);
      Literal* lit = static_cast<Literal*>(trm);
      result=Literal::create(lit,argLst);
    } else if(trm->isSort()){
      ASS(!noSharing);
      result=AtomicSort::create(static_cast<AtomicSort*>(trm),argLst);
    } else {
      bool shouldShare=!noSharing && canBeShared(argLst, trm->arity());
      if(shouldShare) {
        result=Term::create(trm,argLst);          
      } else {
        //At the memoent all sorts should be shared.
        result=Term::createNonShared(trm,argLst);
      }
    }
  }

  return result;
}